

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ParseTest::~ParseTest(ParseTest *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ParseTest_001352a0;
  std::__cxx11::string::~string((string *)&this->_test_input);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->_parse)._columns);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

virtual void SetUp() {
        _test_input = "xxxxx\t22\t3.3\tss\tsss\t3:2222,3333,44444\t3:2.0,3.0,4.0\t33 44 55\n";
        _test_size = 8;
        _test_array_length = 3;
    }